

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

int st__strhash(char *string,int modulus)

{
  uint local_28;
  uint val;
  uint c;
  uchar *ustring;
  int modulus_local;
  char *string_local;
  
  local_28 = 0;
  _val = (byte *)string;
  if (modulus < 1) {
    __assert_fail("modulus > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/st/st.c"
                  ,0x1c5,"int st__strhash(const char *, int)");
  }
  while( true ) {
    if (*_val == 0) break;
    local_28 = local_28 * 0x3e5 + (uint)*_val;
    _val = _val + 1;
  }
  return local_28 % (uint)modulus;
}

Assistant:

int
 st__strhash(const char *string, int modulus)
{
    unsigned char * ustring = (unsigned char *)string;
    unsigned c, val = 0;
    assert( modulus > 0 );    
    while ((c = *ustring++) != '\0') {
        val = val*997 + c;
    }
    return (int)(val%modulus);
}